

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O3

void __thiscall
cbtGImpactMeshShape::buildMeshParts
          (cbtGImpactMeshShape *this,cbtStridingMeshInterface *meshInterface)

{
  cbtGImpactMeshShapePart **ptr;
  int iVar1;
  uint uVar2;
  int iVar3;
  cbtGImpactMeshShapePart *this_00;
  cbtGImpactMeshShapePart **ppcVar4;
  ulong uVar5;
  
  iVar1 = (*meshInterface->_vptr_cbtStridingMeshInterface[7])(meshInterface);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      this_00 = (cbtGImpactMeshShapePart *)cbtAlignedAllocInternal(0x118,0x10);
      cbtGImpactMeshShapePart::cbtGImpactMeshShapePart(this_00,meshInterface,iVar1);
      uVar2 = (this->m_mesh_parts).m_size;
      if (uVar2 == (this->m_mesh_parts).m_capacity) {
        iVar3 = uVar2 * 2;
        if (uVar2 == 0) {
          iVar3 = 1;
        }
        if ((int)uVar2 < iVar3) {
          if (iVar3 == 0) {
            ppcVar4 = (cbtGImpactMeshShapePart **)0x0;
          }
          else {
            ppcVar4 = (cbtGImpactMeshShapePart **)cbtAlignedAllocInternal((long)iVar3 << 3,0x10);
            uVar2 = (this->m_mesh_parts).m_size;
          }
          if (0 < (int)uVar2) {
            uVar5 = 0;
            do {
              ppcVar4[uVar5] = (this->m_mesh_parts).m_data[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar2 != uVar5);
          }
          ptr = (this->m_mesh_parts).m_data;
          if ((ptr != (cbtGImpactMeshShapePart **)0x0) &&
             ((this->m_mesh_parts).m_ownsMemory == true)) {
            cbtAlignedFreeInternal(ptr);
            uVar2 = (this->m_mesh_parts).m_size;
          }
          (this->m_mesh_parts).m_ownsMemory = true;
          (this->m_mesh_parts).m_data = ppcVar4;
          (this->m_mesh_parts).m_capacity = iVar3;
        }
      }
      iVar1 = iVar1 + 1;
      (this->m_mesh_parts).m_data[(int)uVar2] = this_00;
      (this->m_mesh_parts).m_size = uVar2 + 1;
      iVar3 = (*meshInterface->_vptr_cbtStridingMeshInterface[7])(meshInterface);
    } while (iVar1 < iVar3);
  }
  return;
}

Assistant:

void buildMeshParts(cbtStridingMeshInterface* meshInterface)
	{
		for (int i = 0; i < meshInterface->getNumSubParts(); ++i)
		{
			cbtGImpactMeshShapePart* newpart = new cbtGImpactMeshShapePart(meshInterface, i);
			m_mesh_parts.push_back(newpart);
		}
	}